

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 GetLine(io_private *pDev,jx9_int64 *pLen,char **pzLine)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  
  pcVar3 = (char *)((ulong)pDev->nOfft + (long)(pDev->sBuffer).pBlob);
  lVar2 = 0;
  do {
    pcVar1 = pcVar3 + lVar2;
    if (pcVar3 + ((pDev->sBuffer).nByte - pDev->nOfft) <= pcVar1) {
      return -6;
    }
    lVar2 = lVar2 + 1;
  } while (*pcVar1 != '\n');
  *pLen = lVar2;
  *pzLine = pcVar3;
  return 0;
}

Assistant:

static sxi32 GetLine(io_private *pDev, jx9_int64 *pLen, const char **pzLine)
{
	const char *zIn, *zEnd, *zPtr;
	zIn = (const char *)SyBlobDataAt(&pDev->sBuffer, pDev->nOfft);
	zEnd = &zIn[SyBlobLength(&pDev->sBuffer)-pDev->nOfft];
	zPtr = zIn;
	while( zIn < zEnd ){
		if( zIn[0] == '\n' ){
			/* Line found */
			zIn++; /* Include the line ending as requested by the JX9 specification */
			*pLen = (jx9_int64)(zIn-zPtr);
			*pzLine = zPtr;
			return SXRET_OK;
		}
		zIn++;
	}
	/* No line were found */
	return SXERR_NOTFOUND;
}